

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_gather.cpp
# Opt level: O3

void duckdb::RowOperations::HeapGather
               (Vector *v,idx_t *vcount,SelectionVector *sel,data_ptr_t *key_locations,
               optional_ptr<duckdb::NestedValidity,_true> parent_validity)

{
  PhysicalType PVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  data_ptr_t pdVar2;
  pointer ppVar3;
  pointer ppVar4;
  unsigned_long *puVar5;
  undefined8 uVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  byte *pbVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  child_list_t<LogicalType> *pcVar12;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  type v_00;
  NotImplementedException *this_02;
  byte bVar13;
  data_ptr_t *ppdVar14;
  ulong uVar15;
  data_ptr_t pdVar16;
  uint *__src;
  size_type child_vector_index;
  idx_t iVar17;
  idx_t vcount_00;
  idx_t i;
  ulong uVar18;
  idx_t iVar19;
  string_t sVar20;
  NestedValidity parent_validity_1;
  data_ptr_t struct_validitymask_locations [2048];
  optional_ptr<duckdb::NestedValidity,_true> local_4070;
  idx_t local_4068;
  idx_t local_4060 [5];
  string local_4038 [512];
  
  ppdVar14 = key_locations;
  local_4070.ptr = parent_validity.ptr;
  Vector::SetVectorType(v,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(v);
  vcount_00 = *vcount;
  pdVar16 = (data_ptr_t)
            CONCAT71((int7)((ulong)ppdVar14 >> 8),
                     vcount_00 != 0 && parent_validity.ptr != (NestedValidity *)0x0);
  if (vcount_00 != 0 && parent_validity.ptr != (NestedValidity *)0x0) {
    uVar18 = 0;
    do {
      optional_ptr<duckdb::NestedValidity,_true>::CheckValid(&local_4070);
      if ((local_4070.ptr)->list_validity_location == (data_ptr_t)0x0) {
        bVar13 = (byte)(local_4070.ptr)->idx_in_entry;
        pbVar9 = (local_4070.ptr)->struct_validity_locations[uVar18] + (local_4070.ptr)->entry_idx;
      }
      else {
        uVar15 = (local_4070.ptr)->list_validity_offset + uVar18;
        bVar13 = (byte)uVar15 & 7;
        pbVar9 = (local_4070.ptr)->list_validity_location + (uVar15 >> 3);
      }
      pdVar16 = (data_ptr_t)(ulong)*pbVar9;
      uVar15 = uVar18;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)sel->sel_vector[uVar18];
      }
      _Var11._M_head_impl = (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (((uint)(1L << (bVar13 & 0x3f)) & (uint)*pbVar9) == 0) {
        if (_Var11._M_head_impl == (unsigned_long *)0x0) {
          local_4060[0] = (v->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_4038,local_4060);
          peVar7 = (element_type *)
                   CONCAT44(local_4038[0]._M_dataplus._M_p._4_4_,
                            (uint)local_4038[0]._M_dataplus._M_p);
          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_4038[0]._M_string_length._4_4_,
                            (undefined4)local_4038[0]._M_string_length);
          local_4038[0]._M_dataplus._M_p._0_4_ = 0;
          local_4038[0]._M_dataplus._M_p._4_4_ = 0;
          local_4038[0]._M_string_length._0_4_ = 0;
          local_4038[0]._M_string_length._4_4_ = 0;
          this = (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar7;
          (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var8;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_4038[0]._M_string_length._4_4_,
                         (undefined4)local_4038[0]._M_string_length) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(local_4038[0]._M_string_length._4_4_,
                                  (undefined4)local_4038[0]._M_string_length));
            }
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(v->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var11._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var11._M_head_impl;
        }
        pdVar16 = (data_ptr_t)(uVar15 & 0xffffffff);
        bVar13 = (byte)pdVar16 & 0x3f;
        _Var11._M_head_impl[uVar15 >> 6] =
             _Var11._M_head_impl[uVar15 >> 6] &
             (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
      }
      else if (_Var11._M_head_impl != (unsigned_long *)0x0) {
        pdVar16 = (data_ptr_t)(uVar15 & 0xffffffff);
        _Var11._M_head_impl[uVar15 >> 6] =
             _Var11._M_head_impl[uVar15 >> 6] | 1L << ((byte)pdVar16 & 0x3f);
      }
      uVar18 = uVar18 + 1;
      vcount_00 = *vcount;
    } while (uVar18 < vcount_00);
  }
  PVar1 = (v->type).physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case BOOL:
    case INT8:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar16[uVar15] = *key_locations[uVar18];
          key_locations[uVar18] = key_locations[uVar18] + 1;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case UINT8:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar16[uVar15] = *key_locations[uVar18];
          key_locations[uVar18] = key_locations[uVar18] + 1;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case UINT16:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar2 = key_locations[uVar18];
          *(undefined2 *)(pdVar16 + uVar15 * 2) = *(undefined2 *)pdVar2;
          key_locations[uVar18] = pdVar2 + 2;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case INT16:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar2 = key_locations[uVar18];
          *(undefined2 *)(pdVar16 + uVar15 * 2) = *(undefined2 *)pdVar2;
          key_locations[uVar18] = pdVar2 + 2;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case UINT32:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar2 = key_locations[uVar18];
          *(undefined4 *)(pdVar16 + uVar15 * 4) = *(undefined4 *)pdVar2;
          key_locations[uVar18] = pdVar2 + 4;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case INT32:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar2 = key_locations[uVar18];
          *(undefined4 *)(pdVar16 + uVar15 * 4) = *(undefined4 *)pdVar2;
          key_locations[uVar18] = pdVar2 + 4;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case UINT64:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar2 = key_locations[uVar18];
          *(undefined8 *)(pdVar16 + uVar15 * 8) = *(undefined8 *)pdVar2;
          key_locations[uVar18] = pdVar2 + 8;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case INT64:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar2 = key_locations[uVar18];
          *(undefined8 *)(pdVar16 + uVar15 * 8) = *(undefined8 *)pdVar2;
          key_locations[uVar18] = pdVar2 + 8;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    default:
switchD_00acf690_caseD_a:
      this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_4038[0]._M_dataplus._M_p = (pointer)&local_4038[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4038,"Unimplemented deserialize from row-format","");
      NotImplementedException::NotImplementedException(this_02,local_4038);
      __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar2 = key_locations[uVar18];
          *(undefined4 *)(pdVar16 + uVar15 * 4) = *(undefined4 *)pdVar2;
          key_locations[uVar18] = pdVar2 + 4;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case DOUBLE:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          pdVar2 = key_locations[uVar18];
          *(undefined8 *)(pdVar16 + uVar15 * 8) = *(undefined8 *)pdVar2;
          key_locations[uVar18] = pdVar2 + 8;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case INTERVAL:
      if (vcount_00 != 0) {
        pdVar16 = v->data;
        uVar18 = 0;
        do {
          uVar15 = uVar18;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar18];
          }
          uVar6 = *(undefined8 *)(key_locations[uVar18] + 8);
          *(undefined8 *)(pdVar16 + uVar15 * 0x10) = *(undefined8 *)key_locations[uVar18];
          *(undefined8 *)(pdVar16 + uVar15 * 0x10 + 8) = uVar6;
          key_locations[uVar18] = key_locations[uVar18] + 0x10;
          uVar18 = uVar18 + 1;
        } while (vcount_00 != uVar18);
      }
      break;
    case LIST:
      HeapGatherListVector(v,vcount_00,sel,key_locations);
      break;
    case STRUCT:
      local_4068 = vcount_00;
      pcVar12 = StructType::GetChildTypes_abi_cxx11_(&v->type);
      if (vcount_00 != 0) {
        ppVar3 = (pcVar12->
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar4 = (pcVar12->
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar17 = 0;
        do {
          pdVar16 = key_locations[iVar17];
          (&local_4038[0]._M_dataplus)[iVar17]._M_p = (pointer)pdVar16;
          key_locations[iVar17] =
               pdVar16 + (((long)ppVar3 - (long)ppVar4 >> 3) * 0x6db6db6db6db6db7 + 7U >> 3);
          iVar17 = iVar17 + 1;
        } while (vcount_00 != iVar17);
      }
      this_00 = StructVector::GetEntries(v);
      if ((pcVar12->
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pcVar12->
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        child_vector_index = 0;
        do {
          NestedValidity::NestedValidity
                    ((NestedValidity *)local_4060,(data_ptr_t *)local_4038,child_vector_index);
          this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[](this_00,child_vector_index);
          v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (this_01);
          HeapGather(v_00,&local_4068,sel,key_locations,(NestedValidity *)local_4060);
          child_vector_index = child_vector_index + 1;
        } while (child_vector_index <
                 (ulong)(((long)(pcVar12->
                                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ).
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pcVar12->
                                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ).
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7
                        ));
      }
      break;
    case ARRAY:
      HeapGatherArrayVector(v,vcount_00,sel,key_locations);
    }
  }
  else if (PVar1 == VARCHAR) {
    FlatVector::VerifyFlatVector(v);
    if (vcount_00 != 0) {
      pdVar2 = v->data;
      iVar17 = 0;
      do {
        iVar19 = iVar17;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar19 = (idx_t)sel->sel_vector[iVar17];
        }
        puVar5 = (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 == (unsigned_long *)0x0) ||
           (pdVar16 = (data_ptr_t)(iVar19 >> 6), (puVar5[(long)pdVar16] >> (iVar19 & 0x3f) & 1) != 0
           )) {
          local_4038[0]._M_dataplus._M_p._0_4_ = *(uint *)key_locations[iVar17];
          uVar18 = (ulong)(uint)local_4038[0]._M_dataplus._M_p;
          __src = (uint *)((long)key_locations[iVar17] + 4);
          key_locations[iVar17] = (data_ptr_t)__src;
          if (uVar18 < 0xd) {
            local_4038[0]._M_string_length._4_4_ = 0;
            local_4038[0]._M_dataplus._M_p._4_4_ = 0;
            local_4038[0]._M_string_length._0_4_ = 0;
            if (uVar18 == 0) {
              __src = (uint *)0x0;
            }
            else {
              switchD_00b03519::default
                        ((void *)((long)&local_4038[0]._M_dataplus._M_p + 4),__src,uVar18);
              __src = (uint *)CONCAT44(local_4038[0]._M_string_length._4_4_,
                                       (undefined4)local_4038[0]._M_string_length);
            }
          }
          else {
            local_4038[0]._M_dataplus._M_p._4_4_ = *__src;
          }
          sVar20.value.pointer.ptr = (char *)pdVar16;
          sVar20.value._0_8_ = __src;
          local_4038[0]._M_string_length = (size_type)__src;
          sVar20 = StringVector::AddStringOrBlob
                             ((StringVector *)v,
                              (Vector *)
                              CONCAT44(local_4038[0]._M_dataplus._M_p._4_4_,
                                       (uint)local_4038[0]._M_dataplus._M_p),sVar20);
          *(long *)(pdVar2 + iVar19 * 0x10) = sVar20.value._0_8_;
          *(long *)(pdVar2 + iVar19 * 0x10 + 8) = sVar20.value._8_8_;
          key_locations[iVar17] = key_locations[iVar17] + uVar18;
          pdVar16 = pdVar2;
        }
        iVar17 = iVar17 + 1;
      } while (vcount_00 != iVar17);
    }
  }
  else if (PVar1 == UINT128) {
    if (vcount_00 != 0) {
      pdVar16 = v->data;
      uVar18 = 0;
      do {
        uVar15 = uVar18;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar15 = (ulong)sel->sel_vector[uVar18];
        }
        pdVar2 = key_locations[uVar18];
        uVar6 = *(undefined8 *)(pdVar2 + 8);
        *(undefined8 *)(pdVar16 + uVar15 * 0x10) = *(undefined8 *)pdVar2;
        *(undefined8 *)(pdVar16 + uVar15 * 0x10 + 8) = uVar6;
        key_locations[uVar18] = pdVar2 + 0x10;
        uVar18 = uVar18 + 1;
      } while (vcount_00 != uVar18);
    }
  }
  else {
    if (PVar1 != INT128) goto switchD_00acf690_caseD_a;
    if (vcount_00 != 0) {
      pdVar16 = v->data;
      uVar18 = 0;
      do {
        uVar15 = uVar18;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar15 = (ulong)sel->sel_vector[uVar18];
        }
        pdVar2 = key_locations[uVar18];
        uVar6 = *(undefined8 *)(pdVar2 + 8);
        *(undefined8 *)(pdVar16 + uVar15 * 0x10) = *(undefined8 *)pdVar2;
        *(undefined8 *)(pdVar16 + uVar15 * 0x10 + 8) = uVar6;
        key_locations[uVar18] = pdVar2 + 0x10;
        uVar18 = uVar18 + 1;
      } while (vcount_00 != uVar18);
    }
  }
  return;
}

Assistant:

void RowOperations::HeapGather(Vector &v, const idx_t &vcount, const SelectionVector &sel, data_ptr_t *key_locations,
                               optional_ptr<NestedValidity> parent_validity) {
	v.SetVectorType(VectorType::FLAT_VECTOR);

	auto &validity = FlatVector::Validity(v);
	if (parent_validity) {
		for (idx_t i = 0; i < vcount; i++) {
			const auto valid = parent_validity->IsValid(i);
			const auto col_idx = sel.get_index(i);
			validity.Set(col_idx, valid);
		}
	}

	auto type = v.GetType().InternalType();
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedHeapGather<int8_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT16:
		TemplatedHeapGather<int16_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT32:
		TemplatedHeapGather<int32_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT64:
		TemplatedHeapGather<int64_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT8:
		TemplatedHeapGather<uint8_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT16:
		TemplatedHeapGather<uint16_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT32:
		TemplatedHeapGather<uint32_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT64:
		TemplatedHeapGather<uint64_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT128:
		TemplatedHeapGather<hugeint_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT128:
		TemplatedHeapGather<uhugeint_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::FLOAT:
		TemplatedHeapGather<float>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::DOUBLE:
		TemplatedHeapGather<double>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INTERVAL:
		TemplatedHeapGather<interval_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::VARCHAR:
		HeapGatherStringVector(v, vcount, sel, key_locations);
		break;
	case PhysicalType::STRUCT:
		HeapGatherStructVector(v, vcount, sel, key_locations);
		break;
	case PhysicalType::LIST:
		HeapGatherListVector(v, vcount, sel, key_locations);
		break;
	case PhysicalType::ARRAY:
		HeapGatherArrayVector(v, vcount, sel, key_locations);
		break;
	default:
		throw NotImplementedException("Unimplemented deserialize from row-format");
	}
}